

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix maths::operator-(Matrix *m1,Matrix *m2)

{
  Matrix *in_RDX;
  double **extraout_RDX;
  Matrix *in_RDI;
  Matrix MVar1;
  Matrix temp;
  Matrix *m;
  Matrix *this;
  Matrix local_28;
  Matrix *local_18;
  
  m = &local_28;
  this = in_RDI;
  local_18 = in_RDX;
  Matrix::Matrix(in_RDI,m);
  Matrix::operator-=(m,local_18);
  Matrix::Matrix(this,m);
  Matrix::~Matrix(this);
  MVar1.p = extraout_RDX;
  MVar1._0_8_ = in_RDI;
  return MVar1;
}

Assistant:

Matrix operator-(const Matrix& m1, const Matrix& m2)
{
    Matrix temp(m1);
    return (temp -= m2);
}